

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

void HUF_sort(nodeElt *huffNode,U32 *count,U32 maxSymbolValue)

{
  uint uVar1;
  uint uVar2;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  U32 base;
  U32 pos;
  U32 r_1;
  U32 c;
  U32 r;
  U32 n;
  rankPos rank [32];
  uint local_12c;
  uint local_11c;
  uint local_118 [65];
  uint local_14;
  long local_10;
  long local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_118,0,0x100);
  for (local_11c = 0; local_11c <= local_14; local_11c = local_11c + 1) {
    uVar1 = BIT_highbit32(*(int *)(local_10 + (ulong)local_11c * 4) + 1);
    local_118[(ulong)uVar1 * 2] = local_118[(ulong)uVar1 * 2] + 1;
  }
  for (local_11c = 0x1e; local_11c != 0; local_11c = local_11c - 1) {
    local_118[(ulong)(local_11c - 1) * 2] =
         local_118[(ulong)local_11c * 2] + local_118[(ulong)(local_11c - 1) * 2];
  }
  for (local_11c = 0; local_11c < 0x20; local_11c = local_11c + 1) {
    local_118[(ulong)local_11c * 2 + 1] = local_118[(ulong)local_11c * 2];
  }
  for (local_11c = 0; local_11c <= local_14; local_11c = local_11c + 1) {
    uVar1 = *(uint *)(local_10 + (ulong)local_11c * 4);
    uVar2 = BIT_highbit32(uVar1 + 1);
    uVar2 = uVar2 + 1;
    local_12c = local_118[(ulong)uVar2 * 2 + 1];
    local_118[(ulong)uVar2 * 2 + 1] = local_12c + 1;
    uVar2 = local_118[(ulong)uVar2 * 2];
    while ((uVar2 < local_12c && (*(uint *)(local_8 + (ulong)(local_12c - 1) * 8) < uVar1))) {
      *(undefined8 *)(local_8 + (ulong)local_12c * 8) =
           *(undefined8 *)(local_8 + (ulong)(local_12c - 1) * 8);
      local_12c = local_12c - 1;
    }
    *(uint *)(local_8 + (ulong)local_12c * 8) = uVar1;
    *(char *)(local_8 + 6 + (ulong)local_12c * 8) = (char)local_11c;
  }
  return;
}

Assistant:

static void HUF_sort(nodeElt* huffNode, const U32* count, U32 maxSymbolValue)
{
    rankPos rank[32];
    U32 n;

    memset(rank, 0, sizeof(rank));
    for (n=0; n<=maxSymbolValue; n++) {
        U32 r = BIT_highbit32(count[n] + 1);
        rank[r].base ++;
    }
    for (n=30; n>0; n--) rank[n-1].base += rank[n].base;
    for (n=0; n<32; n++) rank[n].current = rank[n].base;
    for (n=0; n<=maxSymbolValue; n++) {
        U32 const c = count[n];
        U32 const r = BIT_highbit32(c+1) + 1;
        U32 pos = rank[r].current++;
        U32 const base = rank[r].base;
        while (pos > base) {
            if (c <= huffNode[pos - 1].count) {
                break;
            }
            huffNode[pos] = huffNode[pos - 1];
            pos--;
        }
        huffNode[pos].count = c;
        huffNode[pos].byte  = (BYTE)n;
    }
}